

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O3

void __thiscall
glcts::TestConfiguration<int,_int>::TestConfiguration
          (TestConfiguration<int,_int> *this,TestConfiguration<int,_int> *configuration)

{
  GLsizei GVar1;
  GLenum GVar2;
  GLenum GVar3;
  GLenum GVar4;
  GLuint GVar5;
  GLuint GVar6;
  int iVar7;
  int iVar8;
  
  this->_vptr_TestConfiguration = (_func_int **)&PTR__TestConfiguration_0210edc8;
  GVar1 = configuration->m_n_out_components;
  GVar2 = configuration->m_target;
  GVar3 = configuration->m_input_internal_format;
  this->m_n_in_components = configuration->m_n_in_components;
  this->m_n_out_components = GVar1;
  this->m_target = GVar2;
  this->m_input_internal_format = GVar3;
  GVar2 = configuration->m_filtering;
  GVar3 = configuration->m_input_format;
  GVar4 = configuration->m_output_format;
  this->m_output_internal_format = configuration->m_output_internal_format;
  this->m_filtering = GVar2;
  this->m_input_format = GVar3;
  this->m_output_format = GVar4;
  GVar5 = configuration->m_height;
  GVar6 = configuration->m_depth;
  iVar7 = configuration->m_init_value;
  this->m_width = configuration->m_width;
  this->m_height = GVar5;
  this->m_depth = GVar6;
  this->m_init_value = iVar7;
  iVar7 = configuration->m_expected_value;
  iVar8 = configuration->m_expected_border_color;
  GVar2 = configuration->m_input_type;
  this->m_init_border_color = configuration->m_init_border_color;
  this->m_expected_value = iVar7;
  this->m_expected_border_color = iVar8;
  this->m_input_type = GVar2;
  this->m_output_type = configuration->m_output_type;
  return;
}

Assistant:

TestConfiguration<InputType, OutputType>::TestConfiguration(const TestConfiguration& configuration)
{
	m_n_in_components		 = configuration.get_n_in_components();
	m_n_out_components		 = configuration.get_n_out_components();
	m_target				 = configuration.get_target();
	m_input_internal_format  = configuration.get_input_internal_format();
	m_output_internal_format = configuration.get_output_internal_format();
	m_filtering				 = configuration.get_filtering();
	m_input_format			 = configuration.get_input_format();
	m_output_format			 = configuration.get_output_format();
	m_width					 = configuration.get_width();
	m_height				 = configuration.get_height();
	m_depth					 = configuration.get_depth();
	m_init_value			 = configuration.get_init_value();
	m_init_border_color		 = configuration.get_init_border_color();
	m_expected_value		 = configuration.get_expected_value();
	m_expected_border_color  = configuration.get_expected_border_color();
	m_input_type			 = configuration.get_input_type();
	m_output_type			 = configuration.get_output_type();
}